

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O1

SRes SeqInStream_Read(ISeqInStream *stream,void *buf,size_t size)

{
  bool bVar1;
  SRes SVar2;
  SRes unaff_EBP;
  size_t processed;
  size_t local_30;
  
  do {
    if (size == 0) {
      return 0;
    }
    local_30 = size;
    SVar2 = (*stream->Read)(stream,buf,&local_30);
    if (SVar2 == 0) {
      if (local_30 == 0) {
        SVar2 = 6;
        goto LAB_005d0ae1;
      }
      buf = (void *)((long)buf + local_30);
      size = size - local_30;
      bVar1 = true;
    }
    else {
LAB_005d0ae1:
      bVar1 = false;
      unaff_EBP = SVar2;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

SRes SeqInStream_Read(ISeqInStream *stream, void *buf, size_t size)
{
  return SeqInStream_Read2(stream, buf, size, SZ_ERROR_INPUT_EOF);
}